

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O0

void __thiscall
Engine_testObserveIntegerNoTags_Test::~Engine_testObserveIntegerNoTags_Test
          (Engine_testObserveIntegerNoTags_Test *this)

{
  void *in_RDI;
  
  ~Engine_testObserveIntegerNoTags_Test((Engine_testObserveIntegerNoTags_Test *)0x1304e8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Engine, testObserveIntegerNoTags) {
    Engine e("test", std::move(std::make_unique<TestHandler>()));
    e.Observe("histo.value", 42);
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->intMeasures.size());
    auto im = th->intMeasures[0];
    ASSERT_EQ("test.histo.value", im.name);
    ASSERT_EQ(MetricType::Histogram, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(42, im.value);
    ASSERT_EQ(0, im.tags.size());
}